

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

bool __thiscall IPStats::LoadCsvFile(IPStats *this,char *file_name)

{
  IPStatsRecord *pIVar1;
  char *pcVar2;
  bool local_431;
  IPStatsRecord *pIStack_430;
  bool ipsr_stored;
  IPStatsRecord *ipsr;
  char buf [1024];
  FILE *F;
  int last_err;
  bool ret;
  char *file_name_local;
  IPStats *this_local;
  
  F._7_1_ = 1;
  F._0_4_ = 0;
  _last_err = file_name;
  file_name_local = (char *)this;
  buf._1016_8_ = ithi_file_open_ex(file_name,"rt",(int *)&F);
  if ((FILE *)buf._1016_8_ == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open input file %s\n",_last_err);
    F._7_1_ = 0;
  }
  else {
    while (pcVar2 = fgets((char *)&ipsr,0x400,(FILE *)buf._1016_8_), pcVar2 != (char *)0x0) {
      pIStack_430 = IPStatsRecord::ParseLine((char *)&ipsr);
      if (pIStack_430 == (IPStatsRecord *)0x0) {
        fprintf(_stderr,"Cannot parse: %s",&ipsr);
      }
      else {
        local_431 = false;
        BinHash<IPStatsRecord>::InsertOrAdd(&this->ip_records,pIStack_430,false,&local_431);
        pIVar1 = pIStack_430;
        if (((local_431 & 1U) == 0) && (pIStack_430 != (IPStatsRecord *)0x0)) {
          IPStatsRecord::~IPStatsRecord(pIStack_430);
          operator_delete(pIVar1);
        }
      }
    }
    fclose((FILE *)buf._1016_8_);
  }
  return (bool)(F._7_1_ & 1);
}

Assistant:

bool IPStats::LoadCsvFile(char const* file_name)
{
    bool ret = true;
    int last_err = 0;
    FILE* F = ithi_file_open_ex(file_name, "rt", &last_err);

    if (F == NULL) {
        fprintf(stderr, "Cannot open input file %s\n", file_name);
        ret = false;
    }
    else {
        char buf[1024];

        while (fgets(buf, 1024, F) != NULL) {
            IPStatsRecord* ipsr = IPStatsRecord::ParseLine(buf);

            if (ipsr != NULL) {
                bool ipsr_stored = false;
                this->ip_records.InsertOrAdd(ipsr, false, &ipsr_stored);
                if (!ipsr_stored) {
                    delete ipsr;
                }
            }
            else {
                fprintf(stderr, "Cannot parse: %s", buf);
            }
        }

        fclose(F);
    }
    return ret;
}